

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum pbrt::FastExp(SampledSpectrum *s)

{
  array<float,_4> aVar1;
  Float *pFVar2;
  int i;
  SampledSpectrum ret;
  int in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  int iVar3;
  float in_stack_fffffffffffffff0;
  undefined1 auStack_c [12];
  
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x68e6e3);
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    SampledSpectrum::operator[]
              ((SampledSpectrum *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
    in_stack_ffffffffffffffe0 = FastExp(in_stack_fffffffffffffff0);
    pFVar2 = SampledSpectrum::operator[]
                       ((SampledSpectrum *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    *pFVar2 = in_stack_ffffffffffffffe0;
  }
  aVar1.values._4_12_ = auStack_c;
  aVar1.values[0] = in_stack_fffffffffffffff0;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum FastExp(const SampledSpectrum &s) {
    SampledSpectrum ret;
    for (int i = 0; i < NSpectrumSamples; ++i)
        ret[i] = FastExp(s[i]);
    DCHECK(!ret.HasNaNs());
    return ret;
}